

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted-usec-list.c
# Opt level: O0

void lws_sul_schedule_wakesuspend
               (lws_context *ctx,int tsi,lws_sorted_usec_list_t *sul,sul_cb_t _cb,lws_usec_t _us)

{
  lws_usec_t lVar1;
  lws_context_per_thread *_pt;
  lws_usec_t _us_local;
  sul_cb_t _cb_local;
  lws_sorted_usec_list_t *sul_local;
  int tsi_local;
  lws_context *ctx_local;
  
  if (_cb != (sul_cb_t)0x0) {
    if (_us == -1) {
      lws_sul_cancel(sul);
    }
    else {
      sul->cb = _cb;
      lVar1 = lws_now_usecs();
      sul->us = lVar1 + _us;
      lws_sul2_schedule(ctx,tsi,1,sul);
    }
    return;
  }
  __assert_fail("_cb",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/sorted-usec-list.c"
                ,299,
                "void lws_sul_schedule_wakesuspend(struct lws_context *, int, lws_sorted_usec_list_t *, sul_cb_t, lws_usec_t)"
               );
}

Assistant:

void
lws_sul_schedule_wakesuspend(struct lws_context *ctx, int tsi,
			     lws_sorted_usec_list_t *sul, sul_cb_t _cb,
			     lws_usec_t _us)
{
	struct lws_context_per_thread *_pt = &ctx->pt[tsi];

	assert(_cb);

	lws_pt_lock(_pt, __func__);

	if (_us == (lws_usec_t)LWS_SET_TIMER_USEC_CANCEL)
		lws_sul_cancel(sul);
	else {
		sul->cb = _cb;
		sul->us = lws_now_usecs() + _us;
		lws_sul2_schedule(ctx, tsi, LWSSULLI_WAKE_IF_SUSPENDED, sul);
	}

	lws_pt_unlock(_pt);
}